

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

void clear_memory(TRIPLEYCbCr **mrx,int h)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)h;
  if (h < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    if (mrx[uVar2] != (TRIPLEYCbCr *)0x0) {
      operator_delete__(mrx[uVar2]);
    }
  }
  if (mrx != (TRIPLEYCbCr **)0x0) {
    operator_delete__(mrx);
    return;
  }
  return;
}

Assistant:

void clear_memory(TRIPLEYCbCr **mrx, int h) {
    for (int i = 0; i < h; i++)
        delete[] mrx[i];
    delete[] mrx;
}